

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

uint FindNextPattern(uchar *buffer,uint size,uint offset,uchar *pattern,uint size_of_pattern)

{
  int iVar1;
  void *__s2;
  bool bVar2;
  int local_44;
  uint uStack_40;
  uchar c;
  int j;
  uint i;
  int index;
  uchar *pattern_in_bits;
  uint size_of_pattern_local;
  uchar *pattern_local;
  uint offset_local;
  uint size_local;
  uchar *buffer_local;
  
  __s2 = operator_new__((ulong)(size_of_pattern << 3));
  j = 0;
  for (uStack_40 = 0; pattern_local._0_4_ = offset, uStack_40 < size_of_pattern;
      uStack_40 = uStack_40 + 1) {
    for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
      *(byte *)((long)__s2 + (long)j) =
           (byte)((int)(uint)pattern[uStack_40] >> (7U - (char)local_44 & 0x1f)) & 1;
      j = j + 1;
    }
  }
  while( true ) {
    bVar2 = false;
    if ((uint)pattern_local < size) {
      iVar1 = memcmp(buffer + (uint)pattern_local,__s2,(ulong)(size_of_pattern << 3));
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    pattern_local._0_4_ = (uint)pattern_local + 1;
  }
  if (__s2 != (void *)0x0) {
    operator_delete__(__s2);
  }
  if ((uint)pattern_local == size) {
    buffer_local._4_4_ = 0xffffffff;
  }
  else {
    buffer_local._4_4_ = (uint)pattern_local;
  }
  return buffer_local._4_4_;
}

Assistant:

unsigned int FindNextPattern(unsigned char* buffer, unsigned int size, unsigned int offset,
                             const unsigned char* pattern, unsigned int size_of_pattern)
{
   // Convert pattern to bit array
   unsigned char* pattern_in_bits = new unsigned char[size_of_pattern * 8];
   int index = 0;
   for (unsigned int i = 0; i < size_of_pattern; i++)
   {
      for (int j = 0; j < 8; j++)
      {
         unsigned char c = ((pattern[i] >> (7 - j)) & 0x01);
         pattern_in_bits[index++] = c;
      }
   }

   // Find this array

   while (offset < size && memcmp(&buffer[offset], pattern_in_bits, size_of_pattern * 8) != 0)
   {
      ++offset;
   }

   delete[]pattern_in_bits;

   if (offset == size) return -1;
   return offset;
}